

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::InstanceArrayIntersectorK<8>_>,_false>
     ::intersectCoherent(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,
                        RayQueryContext *context)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  float *pfVar4;
  undefined4 uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  int aiVar8 [8];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  NodeRef nodeRef;
  Primitive_conflict4 *prim;
  ulong uVar35;
  ulong *puVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  undefined1 auVar73 [16];
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  Precalculations pre;
  vbool<8> valid_leaf;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  Precalculations local_2791;
  ulong local_2790;
  ulong uStack_2788;
  AccelData *local_2780;
  ulong local_2778;
  ulong local_2770;
  ulong local_2768;
  ulong local_2760;
  RayHitK<8> *local_2758;
  RayQueryContext *local_2750;
  ulong local_2748;
  undefined1 local_2740 [32];
  undefined1 local_2710 [16];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_2700;
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  float local_26a0;
  float fStack_269c;
  float fStack_2698;
  float fStack_2694;
  float fStack_2690;
  float fStack_268c;
  float fStack_2688;
  float fStack_2684;
  float local_2680;
  float fStack_267c;
  float fStack_2678;
  float fStack_2674;
  float fStack_2670;
  float fStack_266c;
  float fStack_2668;
  float fStack_2664;
  float local_2660;
  float fStack_265c;
  float fStack_2658;
  float fStack_2654;
  float fStack_2650;
  float fStack_264c;
  float fStack_2648;
  float fStack_2644;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [8];
  float fStack_2538;
  float fStack_2534;
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  undefined1 local_2520 [32];
  undefined1 local_2500 [8];
  float fStack_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [8];
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  undefined1 local_24a0 [32];
  undefined1 local_2480 [8];
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  undefined1 local_2460 [32];
  undefined1 local_2440 [8];
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  undefined1 local_2420 [32];
  undefined1 local_2400 [8];
  float fStack_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  undefined1 auVar57 [64];
  undefined1 auVar56 [64];
  undefined1 auVar62 [64];
  undefined1 auVar61 [64];
  
  auVar9 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar37 = vpcmpeqd_avx(auVar9,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
  auVar9 = vpcmpeqd_avx(auVar9,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
  auVar9 = vpackssdw_avx(auVar37,auVar9);
  if ((((((((((((((((auVar9 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar9 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar9 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar9 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar9 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar9 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar9 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar9 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar9 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar9 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar9 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar9 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar9 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar9 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar9 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar9[0xf]) {
    return;
  }
  auVar37 = vpacksswb_avx(auVar9,auVar9);
  local_2780 = This->ptr;
  local_2770 = (ulong)(byte)(SUB161(auVar37 >> 7,0) & 1 | (SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                             (SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                             (SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                             (SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                             (SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                             (SUB161(auVar37 >> 0x37,0) & 1) << 6 | SUB161(auVar37 >> 0x3f,0) << 7);
  local_2600 = *(undefined8 *)ray;
  uStack_25f8 = *(undefined8 *)(ray + 8);
  uStack_25f0 = *(undefined8 *)(ray + 0x10);
  uStack_25e8 = *(undefined8 *)(ray + 0x18);
  local_2620 = *(undefined8 *)(ray + 0x20);
  uStack_2618 = *(undefined8 *)(ray + 0x28);
  uStack_2610 = *(undefined8 *)(ray + 0x30);
  uStack_2608 = *(undefined8 *)(ray + 0x38);
  local_2640 = *(undefined8 *)(ray + 0x40);
  uStack_2638 = *(undefined8 *)(ray + 0x48);
  uStack_2630 = *(undefined8 *)(ray + 0x50);
  uStack_2628 = *(undefined8 *)(ray + 0x58);
  auVar46 = *(undefined1 (*) [32])(ray + 0x80);
  auVar60._8_4_ = 0x7fffffff;
  auVar60._0_8_ = 0x7fffffff7fffffff;
  auVar60._12_4_ = 0x7fffffff;
  auVar60._16_4_ = 0x7fffffff;
  auVar60._20_4_ = 0x7fffffff;
  auVar60._24_4_ = 0x7fffffff;
  auVar60._28_4_ = 0x7fffffff;
  auVar55 = vandps_avx(auVar46,auVar60);
  auVar64._8_4_ = 0x219392ef;
  auVar64._0_8_ = 0x219392ef219392ef;
  auVar64._12_4_ = 0x219392ef;
  auVar64._16_4_ = 0x219392ef;
  auVar64._20_4_ = 0x219392ef;
  auVar64._24_4_ = 0x219392ef;
  auVar64._28_4_ = 0x219392ef;
  auVar55 = vcmpps_avx(auVar55,auVar64,1);
  auVar65 = vblendvps_avx(auVar46,auVar64,auVar55);
  auVar55 = *(undefined1 (*) [32])(ray + 0xa0);
  auVar39 = vandps_avx(auVar55,auVar60);
  auVar39 = vcmpps_avx(auVar39,auVar64,1);
  auVar6 = vblendvps_avx(auVar55,auVar64,auVar39);
  auVar39 = *(undefined1 (*) [32])(ray + 0xc0);
  auVar54 = vandps_avx(auVar39,auVar60);
  auVar54 = vcmpps_avx(auVar54,auVar64,1);
  auVar54 = vblendvps_avx(auVar39,auVar64,auVar54);
  auVar10 = vrcpps_avx(auVar65);
  fVar74 = auVar10._0_4_;
  fVar75 = auVar10._4_4_;
  auVar11._4_4_ = fVar75 * auVar65._4_4_;
  auVar11._0_4_ = fVar74 * auVar65._0_4_;
  fVar76 = auVar10._8_4_;
  auVar11._8_4_ = fVar76 * auVar65._8_4_;
  fVar77 = auVar10._12_4_;
  auVar11._12_4_ = fVar77 * auVar65._12_4_;
  fVar78 = auVar10._16_4_;
  auVar11._16_4_ = fVar78 * auVar65._16_4_;
  fVar79 = auVar10._20_4_;
  auVar11._20_4_ = fVar79 * auVar65._20_4_;
  fVar80 = auVar10._24_4_;
  auVar11._24_4_ = fVar80 * auVar65._24_4_;
  auVar11._28_4_ = auVar65._28_4_;
  auVar81._8_4_ = 0x3f800000;
  auVar81._0_8_ = 0x3f8000003f800000;
  auVar81._12_4_ = 0x3f800000;
  auVar81._16_4_ = 0x3f800000;
  auVar81._20_4_ = 0x3f800000;
  auVar81._24_4_ = 0x3f800000;
  auVar81._28_4_ = 0x3f800000;
  auVar11 = vsubps_avx(auVar81,auVar11);
  auVar65 = vrcpps_avx(auVar6);
  fStack_2644 = auVar10._28_4_ + auVar11._28_4_;
  local_2660 = fVar74 + fVar74 * auVar11._0_4_;
  fStack_265c = fVar75 + fVar75 * auVar11._4_4_;
  fStack_2658 = fVar76 + fVar76 * auVar11._8_4_;
  fStack_2654 = fVar77 + fVar77 * auVar11._12_4_;
  fStack_2650 = fVar78 + fVar78 * auVar11._16_4_;
  fStack_264c = fVar79 + fVar79 * auVar11._20_4_;
  fStack_2648 = fVar80 + fVar80 * auVar11._24_4_;
  fVar74 = auVar65._0_4_;
  fVar75 = auVar65._4_4_;
  auVar10._4_4_ = fVar75 * auVar6._4_4_;
  auVar10._0_4_ = fVar74 * auVar6._0_4_;
  fVar76 = auVar65._8_4_;
  auVar10._8_4_ = fVar76 * auVar6._8_4_;
  fVar77 = auVar65._12_4_;
  auVar10._12_4_ = fVar77 * auVar6._12_4_;
  fVar78 = auVar65._16_4_;
  auVar10._16_4_ = fVar78 * auVar6._16_4_;
  fVar79 = auVar65._20_4_;
  auVar10._20_4_ = fVar79 * auVar6._20_4_;
  fVar80 = auVar65._24_4_;
  auVar10._24_4_ = fVar80 * auVar6._24_4_;
  auVar10._28_4_ = fStack_2644;
  auVar6 = vsubps_avx(auVar81,auVar10);
  local_2680 = fVar74 + fVar74 * auVar6._0_4_;
  fStack_267c = fVar75 + fVar75 * auVar6._4_4_;
  fStack_2678 = fVar76 + fVar76 * auVar6._8_4_;
  fStack_2674 = fVar77 + fVar77 * auVar6._12_4_;
  fStack_2670 = fVar78 + fVar78 * auVar6._16_4_;
  fStack_266c = fVar79 + fVar79 * auVar6._20_4_;
  fStack_2668 = fVar80 + fVar80 * auVar6._24_4_;
  fStack_2664 = auVar65._28_4_ + auVar6._28_4_;
  auVar65 = vrcpps_avx(auVar54);
  fVar74 = auVar65._0_4_;
  fVar75 = auVar65._4_4_;
  auVar6._4_4_ = auVar54._4_4_ * fVar75;
  auVar6._0_4_ = auVar54._0_4_ * fVar74;
  fVar76 = auVar65._8_4_;
  auVar6._8_4_ = auVar54._8_4_ * fVar76;
  fVar77 = auVar65._12_4_;
  auVar6._12_4_ = auVar54._12_4_ * fVar77;
  fVar78 = auVar65._16_4_;
  auVar6._16_4_ = auVar54._16_4_ * fVar78;
  fVar79 = auVar65._20_4_;
  auVar6._20_4_ = auVar54._20_4_ * fVar79;
  fVar80 = auVar65._24_4_;
  auVar6._24_4_ = auVar54._24_4_ * fVar80;
  auVar6._28_4_ = auVar54._28_4_;
  auVar54 = vsubps_avx(auVar81,auVar6);
  local_26a0 = fVar74 + fVar74 * auVar54._0_4_;
  fStack_269c = fVar75 + fVar75 * auVar54._4_4_;
  fStack_2698 = fVar76 + fVar76 * auVar54._8_4_;
  fStack_2694 = fVar77 + fVar77 * auVar54._12_4_;
  fStack_2690 = fVar78 + fVar78 * auVar54._16_4_;
  fStack_268c = fVar79 + fVar79 * auVar54._20_4_;
  fStack_2688 = fVar80 + fVar80 * auVar54._24_4_;
  fStack_2684 = auVar65._28_4_ + auVar54._28_4_;
  auVar54 = ZEXT1232(ZEXT412(0)) << 0x20;
  local_25a0 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar54);
  local_25c0 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar54);
  auVar54 = ZEXT1232(ZEXT412(0)) << 0x20;
  auVar46 = vcmpps_avx(auVar46,auVar54,1);
  auVar65._8_4_ = 1;
  auVar65._0_8_ = 0x100000001;
  auVar65._12_4_ = 1;
  auVar65._16_4_ = 1;
  auVar65._20_4_ = 1;
  auVar65._24_4_ = 1;
  auVar65._28_4_ = 1;
  auVar46 = vandps_avx(auVar46,auVar65);
  auVar55 = vcmpps_avx(auVar55,auVar54,1);
  auVar66._8_4_ = 2;
  auVar66._0_8_ = 0x200000002;
  auVar66._12_4_ = 2;
  auVar66._16_4_ = 2;
  auVar66._20_4_ = 2;
  auVar66._24_4_ = 2;
  auVar66._28_4_ = 2;
  auVar55 = vandps_avx(auVar55,auVar66);
  auVar55 = vorps_avx(auVar55,auVar46);
  auVar46 = vcmpps_avx(auVar39,auVar54,1);
  auVar54._8_4_ = 4;
  auVar54._0_8_ = 0x400000004;
  auVar54._12_4_ = 4;
  auVar54._16_4_ = 4;
  auVar54._20_4_ = 4;
  auVar54._24_4_ = 4;
  auVar54._28_4_ = 4;
  auVar46 = vandps_avx(auVar46,auVar54);
  auVar55 = vorps_avx(auVar55,auVar46);
  auVar37 = vpmovsxwd_avx(auVar9);
  auVar9 = vpunpckhwd_avx(auVar9,auVar9);
  auVar39._16_16_ = auVar9;
  auVar39._0_16_ = auVar37;
  auVar46 = vcmpps_avx(ZEXT1632(auVar37),ZEXT1632(auVar37),0xf);
  local_26c0 = vblendvps_avx(auVar46,auVar55,auVar39);
  local_2758 = ray;
  local_2750 = context;
LAB_0108141e:
  lVar29 = 0;
  if (local_2770 != 0) {
    for (; (local_2770 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
    }
  }
  uVar5 = *(undefined4 *)(local_26c0 + lVar29 * 4);
  auVar37._4_4_ = uVar5;
  auVar37._0_4_ = uVar5;
  auVar37._8_4_ = uVar5;
  auVar37._12_4_ = uVar5;
  auVar9 = vpcmpeqd_avx(auVar37,local_26c0._0_16_);
  auVar37 = vpcmpeqd_avx(auVar37,local_26c0._16_16_);
  auVar9 = vpackssdw_avx(auVar9,auVar37);
  auVar38 = vpmovsxwd_avx(auVar9);
  auVar40._16_16_ = auVar37;
  auVar40._0_16_ = auVar38;
  auVar9 = vpacksswb_avx(auVar9,auVar9);
  auVar82._8_4_ = 0xff800000;
  auVar82._0_8_ = 0xff800000ff800000;
  auVar82._12_4_ = 0xff800000;
  auVar82._16_4_ = 0xff800000;
  auVar82._20_4_ = 0xff800000;
  auVar82._24_4_ = 0xff800000;
  auVar82._28_4_ = 0xff800000;
  auVar46 = vblendvps_avx(auVar82,local_25c0,auVar40);
  auVar84 = ZEXT3264(auVar46);
  auVar23._8_8_ = uStack_25f8;
  auVar23._0_8_ = local_2600;
  auVar23._16_8_ = uStack_25f0;
  auVar23._24_8_ = uStack_25e8;
  auVar83._8_4_ = 0x7f800000;
  auVar83._0_8_ = 0x7f8000007f800000;
  auVar83._12_4_ = 0x7f800000;
  auVar83._16_4_ = 0x7f800000;
  auVar83._20_4_ = 0x7f800000;
  auVar83._24_4_ = 0x7f800000;
  auVar83._28_4_ = 0x7f800000;
  auVar55 = vblendvps_avx(auVar83,auVar23,auVar40);
  local_2778 = ~(ulong)(byte)(SUB161(auVar9 >> 7,0) & 1 | (SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                              (SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                              (SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                              (SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                              (SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                              (SUB161(auVar9 >> 0x37,0) & 1) << 6 | SUB161(auVar9 >> 0x3f,0) << 7);
  auVar39 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar55 = vminps_avx(auVar55,auVar39);
  auVar39 = vshufpd_avx(auVar55,auVar55,5);
  auVar39 = vminps_avx(auVar55,auVar39);
  auVar21._8_8_ = uStack_2618;
  auVar21._0_8_ = local_2620;
  auVar21._16_8_ = uStack_2610;
  auVar21._24_8_ = uStack_2608;
  auVar55 = vblendvps_avx(auVar83,auVar21,auVar40);
  auVar9 = vminps_avx(auVar39._0_16_,auVar39._16_16_);
  auVar39 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar55 = vminps_avx(auVar55,auVar39);
  auVar39 = vshufpd_avx(auVar55,auVar55,5);
  auVar55 = vminps_avx(auVar55,auVar39);
  auVar37 = vminps_avx(auVar55._0_16_,auVar55._16_16_);
  auVar37 = vunpcklps_avx(auVar9,auVar37);
  auVar19._8_8_ = uStack_2638;
  auVar19._0_8_ = local_2640;
  auVar19._16_8_ = uStack_2630;
  auVar19._24_8_ = uStack_2628;
  auVar55 = vblendvps_avx(auVar83,auVar19,auVar40);
  auVar39 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar55 = vminps_avx(auVar55,auVar39);
  auVar39 = vshufpd_avx(auVar55,auVar55,5);
  auVar55 = vminps_avx(auVar55,auVar39);
  auVar9 = vminps_avx(auVar55._0_16_,auVar55._16_16_);
  auVar38 = vinsertps_avx(auVar37,auVar9,0x28);
  auVar55 = vblendvps_avx(auVar82,auVar23,auVar40);
  auVar39 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar55 = vmaxps_avx(auVar55,auVar39);
  auVar39 = vshufpd_avx(auVar55,auVar55,5);
  auVar55 = vmaxps_avx(auVar55,auVar39);
  auVar9 = vmaxps_avx(auVar55._0_16_,auVar55._16_16_);
  auVar55 = vblendvps_avx(auVar82,auVar21,auVar40);
  auVar39 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar55 = vmaxps_avx(auVar55,auVar39);
  auVar39 = vshufpd_avx(auVar55,auVar55,5);
  auVar55 = vmaxps_avx(auVar55,auVar39);
  auVar37 = vmaxps_avx(auVar55._0_16_,auVar55._16_16_);
  auVar37 = vunpcklps_avx(auVar9,auVar37);
  auVar55 = vblendvps_avx(auVar82,auVar19,auVar40);
  auVar39 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar55 = vmaxps_avx(auVar55,auVar39);
  auVar39 = vshufpd_avx(auVar55,auVar55,5);
  auVar55 = vmaxps_avx(auVar55,auVar39);
  auVar9 = vmaxps_avx(auVar55._0_16_,auVar55._16_16_);
  auVar18._4_4_ = fStack_265c;
  auVar18._0_4_ = local_2660;
  auVar18._8_4_ = fStack_2658;
  auVar18._12_4_ = fStack_2654;
  auVar18._16_4_ = fStack_2650;
  auVar18._20_4_ = fStack_264c;
  auVar18._24_4_ = fStack_2648;
  auVar18._28_4_ = fStack_2644;
  auVar55 = vblendvps_avx(auVar83,auVar18,auVar40);
  auVar52 = vinsertps_avx(auVar37,auVar9,0x28);
  auVar39 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar55 = vminps_avx(auVar55,auVar39);
  auVar39 = vshufpd_avx(auVar55,auVar55,5);
  auVar39 = vminps_avx(auVar55,auVar39);
  auVar17._4_4_ = fStack_267c;
  auVar17._0_4_ = local_2680;
  auVar17._8_4_ = fStack_2678;
  auVar17._12_4_ = fStack_2674;
  auVar17._16_4_ = fStack_2670;
  auVar17._20_4_ = fStack_266c;
  auVar17._24_4_ = fStack_2668;
  auVar17._28_4_ = fStack_2664;
  auVar55 = vblendvps_avx(auVar83,auVar17,auVar40);
  auVar9 = vminps_avx(auVar39._0_16_,auVar39._16_16_);
  auVar39 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar55 = vminps_avx(auVar55,auVar39);
  auVar39 = vshufpd_avx(auVar55,auVar55,5);
  auVar55 = vminps_avx(auVar55,auVar39);
  auVar37 = vminps_avx(auVar55._0_16_,auVar55._16_16_);
  auVar37 = vunpcklps_avx(auVar9,auVar37);
  auVar16._4_4_ = fStack_269c;
  auVar16._0_4_ = local_26a0;
  auVar16._8_4_ = fStack_2698;
  auVar16._12_4_ = fStack_2694;
  auVar16._16_4_ = fStack_2690;
  auVar16._20_4_ = fStack_268c;
  auVar16._24_4_ = fStack_2688;
  auVar16._28_4_ = fStack_2684;
  auVar55 = vblendvps_avx(auVar83,auVar16,auVar40);
  auVar39 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar55 = vminps_avx(auVar55,auVar39);
  auVar39 = vshufpd_avx(auVar55,auVar55,5);
  auVar55 = vminps_avx(auVar55,auVar39);
  auVar9 = vminps_avx(auVar55._0_16_,auVar55._16_16_);
  auVar58 = vinsertps_avx(auVar37,auVar9,0x28);
  auVar55 = vblendvps_avx(auVar82,auVar18,auVar40);
  auVar39 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar55 = vmaxps_avx(auVar55,auVar39);
  auVar39 = vshufpd_avx(auVar55,auVar55,5);
  auVar55 = vmaxps_avx(auVar55,auVar39);
  auVar9 = vmaxps_avx(auVar55._0_16_,auVar55._16_16_);
  auVar55 = vblendvps_avx(auVar82,auVar17,auVar40);
  auVar39 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar55 = vmaxps_avx(auVar55,auVar39);
  auVar39 = vshufpd_avx(auVar55,auVar55,5);
  auVar55 = vmaxps_avx(auVar55,auVar39);
  auVar37 = vmaxps_avx(auVar55._0_16_,auVar55._16_16_);
  auVar37 = vunpcklps_avx(auVar9,auVar37);
  auVar55 = vblendvps_avx(auVar82,auVar16,auVar40);
  auVar39 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar55 = vmaxps_avx(auVar55,auVar39);
  auVar39 = vshufpd_avx(auVar55,auVar55,5);
  auVar55 = vmaxps_avx(auVar55,auVar39);
  auVar9 = vmaxps_avx(auVar55._0_16_,auVar55._16_16_);
  local_23c0 = vblendvps_avx(auVar83,local_25a0,auVar40);
  auVar45 = vinsertps_avx(auVar37,auVar9,0x28);
  auVar55 = vshufps_avx(local_23c0,local_23c0,0xb1);
  auVar55 = vminps_avx(local_23c0,auVar55);
  auVar39 = vshufpd_avx(auVar55,auVar55,5);
  auVar55 = vminps_avx(auVar55,auVar39);
  auVar39 = vshufps_avx(auVar46,auVar46,0xb1);
  auVar46 = vmaxps_avx(auVar46,auVar39);
  auVar39 = vshufpd_avx(auVar46,auVar46,5);
  auVar7 = vcmpps_avx(auVar58,_DAT_01f45a50,5);
  auVar9 = vblendvps_avx(auVar45,auVar58,auVar7);
  auVar37 = vblendvps_avx(auVar38,auVar52,auVar7);
  auVar38 = vblendvps_avx(auVar52,auVar38,auVar7);
  auVar46 = vmaxps_avx(auVar46,auVar39);
  auVar52 = vmovshdup_avx(auVar9);
  local_2768 = (ulong)(auVar52._0_4_ < 0.0) << 5 | 0x40;
  auVar52 = vshufpd_avx(auVar9,auVar9,1);
  uVar35 = (ulong)(auVar52._0_4_ < 0.0) << 5 | 0x80;
  local_2748 = local_2768 ^ 0x20;
  auVar53 = vminps_avx(auVar55._0_16_,auVar55._16_16_);
  auVar43 = ZEXT1664(auVar53);
  auVar7 = vblendvps_avx(auVar58,auVar45,auVar7);
  auVar52 = vmaxss_avx(auVar46._0_16_,auVar46._16_16_);
  auVar72 = ZEXT1664(auVar52);
  auVar58._0_4_ = auVar37._0_4_ * auVar9._0_4_;
  auVar58._4_4_ = auVar37._4_4_ * auVar9._4_4_;
  auVar58._8_4_ = auVar37._8_4_ * auVar9._8_4_;
  auVar58._12_4_ = auVar37._12_4_ * auVar9._12_4_;
  auVar61 = ZEXT1664(auVar58);
  auVar52._0_4_ = auVar38._0_4_ * auVar7._0_4_;
  auVar52._4_4_ = auVar38._4_4_ * auVar7._4_4_;
  auVar52._8_4_ = auVar38._8_4_ * auVar7._8_4_;
  auVar52._12_4_ = auVar38._12_4_ * auVar7._12_4_;
  auVar56 = ZEXT1664(auVar52);
  local_2760 = (ulong)(auVar9._0_4_ < 0.0) << 5;
  uVar34 = local_2760 ^ 0x20;
  local_23a0 = *(ulong *)&local_2780[1].bounds.bounds0.lower.field_0;
  local_2398[0] = 0;
  auVar37 = vshufps_avx(auVar9,auVar9,0);
  register0x00001350 = auVar37;
  _local_2400 = auVar37;
  auVar37 = vshufps_avx(auVar58,auVar58,0);
  local_2420._16_16_ = auVar37;
  local_2420._0_16_ = auVar37;
  auVar37 = vshufps_avx(auVar9,auVar9,0x55);
  register0x00001350 = auVar37;
  _local_2440 = auVar37;
  auVar37 = vshufps_avx(auVar58,auVar58,0x55);
  local_2460._16_16_ = auVar37;
  local_2460._0_16_ = auVar37;
  auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
  register0x00001210 = auVar9;
  _local_2480 = auVar9;
  auVar9 = vshufps_avx(auVar58,auVar58,0xaa);
  local_24a0._16_16_ = auVar9;
  local_24a0._0_16_ = auVar9;
  auVar9 = vshufps_avx(auVar7,auVar7,0);
  register0x00001210 = auVar9;
  _local_24c0 = auVar9;
  auVar9 = vshufps_avx(auVar52,auVar52,0);
  local_24e0._16_16_ = auVar9;
  local_24e0._0_16_ = auVar9;
  auVar9 = vshufps_avx(auVar7,auVar7,0x55);
  register0x00001210 = auVar9;
  _local_2500 = auVar9;
  auVar9 = vshufps_avx(auVar52,auVar52,0x55);
  local_2520._16_16_ = auVar9;
  local_2520._0_16_ = auVar9;
  auVar9 = vshufps_avx(auVar7,auVar7,0xaa);
  register0x00001210 = auVar9;
  _local_2540 = auVar9;
  auVar9 = vshufps_avx(auVar52,auVar52,0xaa);
  local_2560._16_16_ = auVar9;
  local_2560._0_16_ = auVar9;
  auVar9 = vshufps_avx(auVar53,auVar53,0);
  local_2580._16_16_ = auVar9;
  local_2580._0_16_ = auVar9;
  puVar36 = local_2390;
  uVar32 = local_2760;
  uVar33 = local_2768;
  do {
    local_2710 = auVar72._0_16_;
    auVar9 = vshufps_avx(local_2710,local_2710,0);
    local_23e0._16_16_ = auVar9;
    local_23e0._0_16_ = auVar9;
    local_25e0 = auVar84._0_32_;
    auVar72 = auVar84;
LAB_010818a6:
    do {
      if (puVar36 == &local_23a0) {
        local_2770 = local_2770 & local_2778;
        if (local_2770 == 0) {
          return;
        }
        goto LAB_0108141e;
      }
      uVar5 = (undefined4)puVar36[-1];
      local_2740._4_4_ = uVar5;
      local_2740._0_4_ = uVar5;
      local_2740._8_4_ = uVar5;
      local_2740._12_4_ = uVar5;
      local_2740._16_4_ = uVar5;
      local_2740._20_4_ = uVar5;
      local_2740._24_4_ = uVar5;
      local_2740._28_4_ = uVar5;
      puVar36 = puVar36 + -2;
      auVar46 = vcmpps_avx(local_2740,auVar72._0_32_,1);
      auVar51 = ZEXT3264(auVar46);
    } while ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                  (auVar46 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar46 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                SUB321(auVar46 >> 0x7f,0) == '\0') &&
               (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              SUB321(auVar46 >> 0xbf,0) == '\0') &&
             (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             -1 < auVar46[0x1f]);
    uVar26 = *puVar36;
LAB_010818d7:
    if ((uVar26 & 8) == 0) {
      pfVar4 = (float *)(uVar26 + 0x40 + uVar32);
      auVar44._0_4_ = (float)local_2400._0_4_ * *pfVar4;
      auVar44._4_4_ = (float)local_2400._4_4_ * pfVar4[1];
      auVar44._8_4_ = fStack_23f8 * pfVar4[2];
      auVar44._12_4_ = fStack_23f4 * pfVar4[3];
      auVar44._16_4_ = fStack_23f0 * pfVar4[4];
      auVar44._20_4_ = fStack_23ec * pfVar4[5];
      auVar44._28_36_ = auVar43._28_36_;
      auVar44._24_4_ = fStack_23e8 * pfVar4[6];
      pfVar4 = (float *)(uVar26 + 0x40 + uVar33);
      auVar43._0_4_ = (float)local_2440._0_4_ * *pfVar4;
      auVar43._4_4_ = (float)local_2440._4_4_ * pfVar4[1];
      auVar43._8_4_ = fStack_2438 * pfVar4[2];
      auVar43._12_4_ = fStack_2434 * pfVar4[3];
      auVar43._16_4_ = fStack_2430 * pfVar4[4];
      auVar43._20_4_ = fStack_242c * pfVar4[5];
      auVar43._28_36_ = auVar51._28_36_;
      auVar43._24_4_ = fStack_2428 * pfVar4[6];
      auVar46 = vsubps_avx(auVar44._0_32_,local_2420);
      auVar55 = vsubps_avx(auVar43._0_32_,local_2460);
      pfVar4 = (float *)(uVar26 + 0x40 + uVar35);
      auVar51._0_4_ = (float)local_2480._0_4_ * *pfVar4;
      auVar51._4_4_ = (float)local_2480._4_4_ * pfVar4[1];
      auVar51._8_4_ = fStack_2478 * pfVar4[2];
      auVar51._12_4_ = fStack_2474 * pfVar4[3];
      auVar51._16_4_ = fStack_2470 * pfVar4[4];
      auVar51._20_4_ = fStack_246c * pfVar4[5];
      auVar51._28_36_ = auVar56._28_36_;
      auVar51._24_4_ = fStack_2468 * pfVar4[6];
      auVar39 = vsubps_avx(auVar51._0_32_,local_24a0);
      pfVar4 = (float *)(uVar26 + 0x40 + uVar34);
      auVar56._0_4_ = (float)local_24c0._0_4_ * *pfVar4;
      auVar56._4_4_ = (float)local_24c0._4_4_ * pfVar4[1];
      auVar56._8_4_ = fStack_24b8 * pfVar4[2];
      auVar56._12_4_ = fStack_24b4 * pfVar4[3];
      auVar56._16_4_ = fStack_24b0 * pfVar4[4];
      auVar56._20_4_ = fStack_24ac * pfVar4[5];
      auVar56._28_36_ = auVar61._28_36_;
      auVar56._24_4_ = fStack_24a8 * pfVar4[6];
      auVar54 = vsubps_avx(auVar56._0_32_,local_24e0);
      auVar37 = vpmaxsd_avx(auVar46._0_16_,auVar55._0_16_);
      auVar38 = vpmaxsd_avx(auVar46._16_16_,auVar55._16_16_);
      auVar7 = vpmaxsd_avx(auVar39._0_16_,local_2580._0_16_);
      auVar37 = vpmaxsd_avx(auVar37,auVar7);
      auVar7 = vpmaxsd_avx(auVar39._16_16_,local_2580._16_16_);
      pfVar4 = (float *)(uVar26 + 0x40 + local_2748);
      auVar67._0_4_ = (float)local_2500._0_4_ * *pfVar4;
      auVar67._4_4_ = (float)local_2500._4_4_ * pfVar4[1];
      auVar67._8_4_ = fStack_24f8 * pfVar4[2];
      auVar67._12_4_ = fStack_24f4 * pfVar4[3];
      auVar67._16_4_ = fStack_24f0 * pfVar4[4];
      auVar67._20_4_ = fStack_24ec * pfVar4[5];
      auVar67._24_4_ = fStack_24e8 * pfVar4[6];
      auVar67._28_4_ = 0;
      auVar46 = vsubps_avx(auVar67,local_2520);
      auVar38 = vpmaxsd_avx(auVar38,auVar7);
      pfVar4 = (float *)(uVar26 + 0x40 + (uVar35 ^ 0x20));
      auVar55._0_4_ = (float)local_2540._0_4_ * *pfVar4;
      auVar55._4_4_ = (float)local_2540._4_4_ * pfVar4[1];
      auVar55._8_4_ = fStack_2538 * pfVar4[2];
      auVar55._12_4_ = fStack_2534 * pfVar4[3];
      auVar55._16_4_ = fStack_2530 * pfVar4[4];
      auVar55._20_4_ = fStack_252c * pfVar4[5];
      auVar55._24_4_ = fStack_2528 * pfVar4[6];
      auVar55._28_4_ = 0;
      auVar55 = vsubps_avx(auVar55,local_2560);
      local_2700.i[4] = auVar38._0_4_;
      local_2700.i[5] = auVar38._4_4_;
      local_2700.i[6] = auVar38._8_4_;
      local_2700.i[7] = auVar38._12_4_;
      local_2700.i[0] = auVar37._0_4_;
      local_2700.i[1] = auVar37._4_4_;
      local_2700.i[2] = auVar37._8_4_;
      local_2700.i[3] = auVar37._12_4_;
      auVar37 = vpminsd_avx(auVar54._0_16_,auVar46._0_16_);
      auVar38 = vpminsd_avx(auVar54._16_16_,auVar46._16_16_);
      auVar61 = ZEXT1664(auVar38);
      auVar7 = vpminsd_avx(auVar55._0_16_,auVar9);
      auVar37 = vpminsd_avx(auVar37,auVar7);
      auVar7 = vpminsd_avx(auVar55._16_16_,auVar9);
      auVar38 = vpminsd_avx(auVar38,auVar7);
      auVar56 = ZEXT1664(auVar38);
      auVar46._16_16_ = auVar38;
      auVar46._0_16_ = auVar37;
      auVar46 = vcmpps_avx((undefined1  [32])local_2700,auVar46,2);
      auVar43 = ZEXT3264(auVar46);
      uVar25 = vmovmskps_avx(auVar46);
      if (uVar25 != 0) {
        uVar31 = (ulong)(uVar25 & 0xff);
        local_2740._8_4_ = 0x7f800000;
        local_2740._0_8_ = 0x7f8000007f800000;
        local_2740._12_4_ = 0x7f800000;
        local_2740._16_4_ = 0x7f800000;
        local_2740._20_4_ = 0x7f800000;
        local_2740._24_4_ = 0x7f800000;
        local_2740._28_4_ = 0x7f800000;
        uVar30 = 0;
        uVar27 = 8;
        do {
          lVar29 = 0;
          if (uVar31 != 0) {
            for (; (uVar31 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
            }
          }
          uVar5 = *(undefined4 *)(uVar26 + 0x40 + lVar29 * 4);
          auVar47._4_4_ = uVar5;
          auVar47._0_4_ = uVar5;
          auVar47._8_4_ = uVar5;
          auVar47._12_4_ = uVar5;
          auVar47._16_4_ = uVar5;
          auVar47._20_4_ = uVar5;
          auVar47._24_4_ = uVar5;
          auVar47._28_4_ = uVar5;
          auVar24._8_8_ = uStack_25f8;
          auVar24._0_8_ = local_2600;
          auVar24._16_8_ = uStack_25f0;
          auVar24._24_8_ = uStack_25e8;
          auVar46 = vsubps_avx(auVar47,auVar24);
          auVar53._0_4_ = local_2660 * auVar46._0_4_;
          auVar53._4_4_ = fStack_265c * auVar46._4_4_;
          auVar53._8_4_ = fStack_2658 * auVar46._8_4_;
          auVar53._12_4_ = fStack_2654 * auVar46._12_4_;
          auVar57._16_4_ = fStack_2650 * auVar46._16_4_;
          auVar57._0_16_ = auVar53;
          auVar57._20_4_ = fStack_264c * auVar46._20_4_;
          auVar57._28_36_ = auVar56._28_36_;
          auVar57._24_4_ = fStack_2648 * auVar46._24_4_;
          uVar5 = *(undefined4 *)(uVar26 + 0x80 + lVar29 * 4);
          auVar48._4_4_ = uVar5;
          auVar48._0_4_ = uVar5;
          auVar48._8_4_ = uVar5;
          auVar48._12_4_ = uVar5;
          auVar48._16_4_ = uVar5;
          auVar48._20_4_ = uVar5;
          auVar48._24_4_ = uVar5;
          auVar48._28_4_ = uVar5;
          auVar22._8_8_ = uStack_2618;
          auVar22._0_8_ = local_2620;
          auVar22._16_8_ = uStack_2610;
          auVar22._24_8_ = uStack_2608;
          auVar46 = vsubps_avx(auVar48,auVar22);
          auVar59._0_4_ = local_2680 * auVar46._0_4_;
          auVar59._4_4_ = fStack_267c * auVar46._4_4_;
          auVar59._8_4_ = fStack_2678 * auVar46._8_4_;
          auVar59._12_4_ = fStack_2674 * auVar46._12_4_;
          auVar62._16_4_ = fStack_2670 * auVar46._16_4_;
          auVar62._0_16_ = auVar59;
          auVar62._20_4_ = fStack_266c * auVar46._20_4_;
          auVar62._28_36_ = auVar61._28_36_;
          auVar62._24_4_ = fStack_2668 * auVar46._24_4_;
          uVar5 = *(undefined4 *)(uVar26 + 0xc0 + lVar29 * 4);
          auVar49._4_4_ = uVar5;
          auVar49._0_4_ = uVar5;
          auVar49._8_4_ = uVar5;
          auVar49._12_4_ = uVar5;
          auVar49._16_4_ = uVar5;
          auVar49._20_4_ = uVar5;
          auVar49._24_4_ = uVar5;
          auVar49._28_4_ = uVar5;
          auVar20._8_8_ = uStack_2638;
          auVar20._0_8_ = local_2640;
          auVar20._16_8_ = uStack_2630;
          auVar20._24_8_ = uStack_2628;
          auVar46 = vsubps_avx(auVar49,auVar20);
          auVar45._0_4_ = local_26a0 * auVar46._0_4_;
          auVar45._4_4_ = fStack_269c * auVar46._4_4_;
          auVar45._8_4_ = fStack_2698 * auVar46._8_4_;
          auVar45._12_4_ = fStack_2694 * auVar46._12_4_;
          auVar12._16_4_ = fStack_2690 * auVar46._16_4_;
          auVar12._0_16_ = auVar45;
          auVar12._20_4_ = fStack_268c * auVar46._20_4_;
          auVar12._24_4_ = fStack_2688 * auVar46._24_4_;
          auVar12._28_4_ = auVar46._28_4_;
          uVar5 = *(undefined4 *)(uVar26 + 0x60 + lVar29 * 4);
          auVar68._4_4_ = uVar5;
          auVar68._0_4_ = uVar5;
          auVar68._8_4_ = uVar5;
          auVar68._12_4_ = uVar5;
          auVar68._16_4_ = uVar5;
          auVar68._20_4_ = uVar5;
          auVar68._24_4_ = uVar5;
          auVar68._28_4_ = uVar5;
          auVar46 = vsubps_avx(auVar68,auVar24);
          auVar71._0_4_ = local_2660 * auVar46._0_4_;
          auVar71._4_4_ = fStack_265c * auVar46._4_4_;
          auVar71._8_4_ = fStack_2658 * auVar46._8_4_;
          auVar71._12_4_ = fStack_2654 * auVar46._12_4_;
          auVar13._16_4_ = fStack_2650 * auVar46._16_4_;
          auVar13._0_16_ = auVar71;
          auVar13._20_4_ = fStack_264c * auVar46._20_4_;
          auVar13._24_4_ = fStack_2648 * auVar46._24_4_;
          auVar13._28_4_ = fStack_2644;
          uVar5 = *(undefined4 *)(uVar26 + 0xa0 + lVar29 * 4);
          auVar69._4_4_ = uVar5;
          auVar69._0_4_ = uVar5;
          auVar69._8_4_ = uVar5;
          auVar69._12_4_ = uVar5;
          auVar69._16_4_ = uVar5;
          auVar69._20_4_ = uVar5;
          auVar69._24_4_ = uVar5;
          auVar69._28_4_ = uVar5;
          auVar46 = vsubps_avx(auVar69,auVar22);
          auVar73._0_4_ = local_2680 * auVar46._0_4_;
          auVar73._4_4_ = fStack_267c * auVar46._4_4_;
          auVar73._8_4_ = fStack_2678 * auVar46._8_4_;
          auVar73._12_4_ = fStack_2674 * auVar46._12_4_;
          auVar14._16_4_ = fStack_2670 * auVar46._16_4_;
          auVar14._0_16_ = auVar73;
          auVar14._20_4_ = fStack_266c * auVar46._20_4_;
          auVar14._24_4_ = fStack_2668 * auVar46._24_4_;
          auVar14._28_4_ = fStack_2664;
          uVar5 = *(undefined4 *)(uVar26 + 0xe0 + lVar29 * 4);
          auVar70._4_4_ = uVar5;
          auVar70._0_4_ = uVar5;
          auVar70._8_4_ = uVar5;
          auVar70._12_4_ = uVar5;
          auVar70._16_4_ = uVar5;
          auVar70._20_4_ = uVar5;
          auVar70._24_4_ = uVar5;
          auVar70._28_4_ = uVar5;
          auVar46 = vsubps_avx(auVar70,auVar20);
          auVar63._0_4_ = local_26a0 * auVar46._0_4_;
          auVar63._4_4_ = fStack_269c * auVar46._4_4_;
          auVar63._8_4_ = fStack_2698 * auVar46._8_4_;
          auVar63._12_4_ = fStack_2694 * auVar46._12_4_;
          auVar15._16_4_ = fStack_2690 * auVar46._16_4_;
          auVar15._0_16_ = auVar63;
          auVar15._20_4_ = fStack_268c * auVar46._20_4_;
          auVar15._24_4_ = fStack_2688 * auVar46._24_4_;
          auVar15._28_4_ = auVar46._28_4_;
          local_26e0 = auVar57._0_32_;
          auVar37 = vpminsd_avx(auVar53,auVar71);
          auVar38 = vpminsd_avx(auVar57._16_16_,auVar13._16_16_);
          auVar7 = vpminsd_avx(auVar59,auVar73);
          auVar37 = vpmaxsd_avx(auVar37,auVar7);
          auVar7 = vpminsd_avx(auVar62._16_16_,auVar14._16_16_);
          auVar38 = vpmaxsd_avx(auVar38,auVar7);
          auVar7 = vpminsd_avx(auVar12._16_16_,auVar15._16_16_);
          auVar7 = vpmaxsd_avx(auVar7,local_23c0._16_16_);
          auVar38 = vpmaxsd_avx(auVar38,auVar7);
          auVar72 = ZEXT3264(auVar84._0_32_);
          auVar7 = vpminsd_avx(auVar45,auVar63);
          auVar7 = vpmaxsd_avx(auVar7,local_23c0._0_16_);
          auVar37 = vpmaxsd_avx(auVar37,auVar7);
          auVar41._16_16_ = auVar38;
          auVar41._0_16_ = auVar37;
          auVar37 = vpmaxsd_avx(auVar71,auVar53);
          auVar38 = vpmaxsd_avx(auVar57._16_16_,auVar13._16_16_);
          auVar7 = vpmaxsd_avx(auVar59,auVar73);
          auVar7 = vpminsd_avx(auVar37,auVar7);
          auVar37 = vpmaxsd_avx(auVar62._16_16_,auVar14._16_16_);
          auVar52 = vpminsd_avx(auVar38,auVar37);
          auVar37 = vpmaxsd_avx(auVar12._16_16_,auVar15._16_16_);
          auVar38 = vpmaxsd_avx(auVar45,auVar63);
          auVar37 = vpminsd_avx(auVar37,auVar84._16_16_);
          auVar61 = ZEXT1664(auVar37);
          auVar37 = vpminsd_avx(auVar52,auVar37);
          auVar56 = ZEXT1664(auVar37);
          auVar38 = vpminsd_avx(auVar38,auVar84._0_16_);
          auVar51 = ZEXT1664(auVar38);
          auVar38 = vpminsd_avx(auVar7,auVar38);
          auVar42._16_16_ = auVar37;
          auVar42._0_16_ = auVar38;
          auVar43 = ZEXT3264(auVar42);
          auVar46 = vcmpps_avx(auVar41,auVar42,2);
          uVar28 = uVar27;
          auVar50 = local_2740;
          if ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar46 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar46 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar46 >> 0x7f,0) != '\0') ||
                (auVar46 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar46 >> 0xbf,0) != '\0') ||
              (auVar46 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar46[0x1f] < '\0') {
            uVar5 = *(undefined4 *)((long)&local_2700 + lVar29 * 4);
            auVar38._4_4_ = uVar5;
            auVar38._0_4_ = uVar5;
            auVar38._8_4_ = uVar5;
            auVar38._12_4_ = uVar5;
            auVar50._16_4_ = uVar5;
            auVar50._0_16_ = auVar38;
            auVar50._20_4_ = uVar5;
            auVar50._24_4_ = uVar5;
            auVar50._28_4_ = uVar5;
            auVar51 = ZEXT3264(auVar50);
            uVar28 = *(ulong *)(uVar26 + lVar29 * 8);
            auVar46 = vcmpps_avx(auVar50,local_2740,1);
            if ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar46 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar46 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar46 >> 0x7f,0) == '\0') &&
                  (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar46 >> 0xbf,0) == '\0') &&
                (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar46[0x1f]) {
              *puVar36 = uVar28;
              uVar28 = uVar27;
            }
            else {
              if (uVar27 == 8) goto LAB_01081c20;
              *puVar36 = uVar27;
              auVar38 = local_2740._0_16_;
              local_2740 = auVar50;
            }
            auVar56 = ZEXT1664(auVar38);
            uVar30 = uVar30 + 1;
            *(int *)(puVar36 + 1) = auVar38._0_4_;
            puVar36 = puVar36 + 2;
            auVar50 = local_2740;
          }
LAB_01081c20:
          local_2740 = auVar50;
          uVar31 = uVar31 & uVar31 - 1;
          uVar27 = uVar28;
        } while (uVar31 != 0);
        if (uVar28 == 8) goto LAB_010818a6;
        uVar26 = uVar28;
        if (1 < uVar30) {
          puVar1 = puVar36 + -4;
          puVar2 = puVar36 + -2;
          if ((uint)puVar36[-3] < (uint)puVar36[-1]) {
            local_2790 = *puVar1;
            uStack_2788 = puVar36[-3];
            *(int *)(puVar36 + -3) = (int)puVar36[-1];
            *puVar1 = *puVar2;
            *puVar2 = local_2790;
            *(undefined4 *)(puVar36 + -1) = (undefined4)uStack_2788;
          }
          if (uVar30 != 2) {
            puVar3 = puVar36 + -6;
            uVar25 = (uint)puVar36[-5];
            if (uVar25 < (uint)puVar36[-1]) {
              local_2790 = *puVar3;
              uStack_2788 = puVar36[-5];
              *(int *)(puVar36 + -5) = (int)puVar36[-1];
              *puVar3 = *puVar2;
              *puVar2 = local_2790;
              *(undefined4 *)(puVar36 + -1) = (undefined4)uStack_2788;
              uVar25 = (uint)puVar36[-5];
            }
            if (uVar25 < (uint)puVar36[-3]) {
              local_2790 = *puVar3;
              uStack_2788 = puVar36[-5];
              *(int *)(puVar36 + -5) = (int)puVar36[-3];
              *puVar3 = *puVar1;
              *puVar1 = local_2790;
              *(undefined4 *)(puVar36 + -3) = (undefined4)uStack_2788;
            }
          }
        }
        goto LAB_010818d7;
      }
      goto LAB_010818a6;
    }
    aiVar8 = (int  [8])vcmpps_avx(auVar72._0_32_,local_2740,6);
    local_2700.i[0] = aiVar8[0];
    local_2700.i[1] = aiVar8[1];
    local_2700.i[2] = aiVar8[2];
    local_2700.i[3] = aiVar8[3];
    local_2700.i[4] = aiVar8[4];
    local_2700.i[5] = aiVar8[5];
    local_2700.i[6] = aiVar8[6];
    local_2700.i[7] = aiVar8[7];
    auVar84 = auVar72;
    if (((((((((undefined1  [32])aiVar8 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             ((undefined1  [32])aiVar8 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            ((undefined1  [32])aiVar8 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321((undefined1  [32])aiVar8 >> 0x7f,0) == '\0') &&
          ((undefined1  [32])aiVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321((undefined1  [32])aiVar8 >> 0xbf,0) == '\0') &&
        ((undefined1  [32])aiVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
        -1 < aiVar8[7]._3_1_) goto LAB_01081dc2;
    prim = (Primitive_conflict4 *)(uVar26 & 0xfffffffffffffff0);
    lVar29 = (ulong)((uint)uVar26 & 0xf) - 8;
    while (lVar29 != 0) {
      local_26e0._0_8_ = lVar29 + -1;
      auVar56 = ZEXT1664(auVar56._0_16_);
      auVar61 = ZEXT1664(auVar61._0_16_);
      InstanceArrayIntersectorK<8>::intersect
                ((vbool<8> *)&local_2700.field_1,&local_2791,ray,local_2750,prim);
      auVar72 = ZEXT3264(local_25e0);
      prim = prim + 1;
      ray = local_2758;
      lVar29 = local_26e0._0_8_;
    }
    auVar46 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar72._0_32_,1);
    auVar43 = ZEXT3264((undefined1  [32])local_2700);
    auVar46 = (undefined1  [32])local_2700 & auVar46;
    uVar32 = local_2760;
    uVar33 = local_2768;
    auVar84 = auVar72;
    if ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar46 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar46 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar46 >> 0x7f,0) == '\0') &&
          (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar46 >> 0xbf,0) == '\0') &&
        (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar46[0x1f]) {
LAB_01081dc2:
      auVar72 = ZEXT1664(local_2710);
    }
    else {
      auVar46 = vblendvps_avx(auVar72._0_32_,*(undefined1 (*) [32])(ray + 0x100),
                              (undefined1  [32])local_2700);
      auVar84 = ZEXT3264(auVar46);
      auVar55 = vshufps_avx(auVar46,auVar46,0xb1);
      auVar46 = vmaxps_avx(auVar46,auVar55);
      auVar55 = vshufpd_avx(auVar46,auVar46,5);
      auVar46 = vmaxps_avx(auVar46,auVar55);
      auVar43 = ZEXT1664(auVar46._16_16_);
      auVar9 = vmaxss_avx(auVar46._0_16_,auVar46._16_16_);
      auVar72 = ZEXT1664(auVar9);
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersectCoherent(vint<K>* __restrict__ valid_i,
                                                                                                       Accel::Intersectors* __restrict__ This,
                                                                                                       RayHitK<K>& __restrict__ ray,
                                                                                                       RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *(float*)&stackPtr->dist;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active))) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            curDist = pos_inf;
            
#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const vfloat<K> childDist = fmin[i];
                const NodeRef child = node->child(i);
                BVHN<N>::prefetch(child);
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    stackPtr->ptr = cur;
                    *(float*)&stackPtr->dist = toScalar(curDist);
                    stackPtr++;
                  }
                  curDist = childDist;
                  cur = child;
                }
                /* push hit child onto stack */
                else {
                  num_child_hits++;
                  stackPtr->ptr = child;
                  *(float*)&stackPtr->dist = toScalar(childDist);
                  stackPtr++;
                }                
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;

            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (stackPtr[-2].dist < stackPtr[-1].dist)
                std::swap(stackPtr[-2],stackPtr[-1]);
              if (unlikely(num_child_hits >= 3))
              {
                if (stackPtr[-3].dist < stackPtr[-1].dist)
                  std::swap(stackPtr[-3],stackPtr[-1]);
                if (stackPtr[-3].dist < stackPtr[-2].dist)
                  std::swap(stackPtr[-3],stackPtr[-2]);
              }
            }
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);

          /* reduce max distance interval on successful intersection */
          if (likely(any((ray.tfar < tray.tfar) & valid_leaf)))
          {
            tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);
            frustum.template updateMaxDist<K>(tray.tfar);
          }

          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        
      } while(valid_bits);
    }